

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

int Get_TopK<4u>(HashMap<4U> *mp,int k)

{
  size_type sVar1;
  _Hash_node_base *p_Var2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  sVar1 = (mp->_M_h)._M_element_count;
  lVar5 = sVar1 << 0x20;
  iVar6 = (int)sVar1;
  uVar7 = (ulong)iVar6;
  puVar3 = (undefined4 *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | lVar5 >> 0x1e);
  puVar4 = puVar3;
  for (p_Var2 = (mp->_M_h)._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
      p_Var2 = p_Var2->_M_nxt) {
    *puVar4 = *(undefined4 *)((long)&p_Var2[1]._M_nxt + 4);
    puVar4 = puVar4 + 1;
  }
  if (k != 0 && lVar5 != 0) {
    std::__introselect<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar3 + uVar7 + -(long)k,puVar3 + uVar7,(int)LZCOUNT(uVar7) * 2 ^ 0x7e);
  }
  iVar6 = puVar3[iVar6 - k];
  operator_delete(puVar3,4);
  return iVar6;
}

Assistant:

int Get_TopK(HashMap<DATA_LEN> mp, int k) {
	int size = mp.size();
	int* num = new int[size];
	int pos = 0;
	typename HashMap<DATA_LEN>::iterator it;
	for (it = mp.begin(); it != mp.end(); ++it) {
		num[pos++] = it->second;
	}
	nth_element(num, num + size - k, num + size);
	int ret = num[size - k];
	delete num;
	return ret;
}